

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O2

CompileMessage * __thiscall
soul::CompileMessageHelpers::
createMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (CompileMessage *__return_storage_ptr__,CompileMessageHelpers *this,Category category,
          CodeLocation *location,Type type,char *text,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  undefined4 in_register_00000014;
  undefined4 in_register_00000084;
  size_t i;
  long lVar1;
  ulong index;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_119;
  Category local_118;
  Type local_114;
  CodeLocation *local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringArgs;
  string result;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50;
  
  local_110 = (CodeLocation *)CONCAT44(in_register_00000014,category);
  local_114 = (Type)location;
  local_118 = (Category)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,(char *)CONCAT44(in_register_00000084,type),
             (allocator<char> *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,(string *)text);
  std::__cxx11::string::string(local_90,(string *)args);
  std::__cxx11::string::string(local_70,(string *)args_1);
  __l._M_len = 3;
  __l._M_array = &local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&stringArgs,__l,&local_119);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_b0._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  lVar1 = 0;
  for (index = 0;
      index < (ulong)((long)stringArgs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)stringArgs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); index = index + 1) {
    std::__cxx11::string::string((string *)&local_50,(string *)&result);
    replaceArgument(&local_b0,&local_50,index,
                    (string *)
                    ((long)&((stringArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar1)
                   );
    std::__cxx11::string::operator=((string *)&result,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    lVar1 = lVar1 + 0x20;
  }
  std::__cxx11::string::string((string *)&local_d0,(string *)&result);
  choc::text::trim(&__return_storage_ptr__->description,&local_d0);
  CodeLocation::CodeLocation(&__return_storage_ptr__->location,local_110);
  __return_storage_ptr__->type = local_114;
  __return_storage_ptr__->category = local_118;
  std::__cxx11::string::~string((string *)&local_d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&stringArgs);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CodeLocation location,
                                         CompileMessage::Type type, const char* text, Args&&... args)
    {
        std::string result (text);
        std::vector<std::string> stringArgs { convertToString (args)... };

        for (size_t i = 0; i < stringArgs.size(); ++i)
            result = replaceArgument (result, i, stringArgs[i]);

        return CompileMessage { choc::text::trim (result), location, type, category };
    }